

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O2

rgb_pixel __thiscall dlib::drawable_window::background_color(drawable_window *this)

{
  rgb_pixel rVar1;
  auto_mutex M;
  
  M.r = (this->super_base_window).wm;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  rVar1 = this->bg_color;
  auto_mutex::~auto_mutex(&M);
  return rVar1;
}

Assistant:

rgb_pixel drawable_window::
    background_color (
    ) const
    {
        auto_mutex M(wm);
        return bg_color;
    }